

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O2

void render(void)

{
  int iVar1;
  Vec3f *pVVar2;
  int k;
  long lVar3;
  long lVar4;
  float *pfVar5;
  int li;
  float fVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec3f pointsLeft [3];
  Vec2f text [3];
  undefined1 local_308 [16];
  Vec3f norms [3];
  pointer local_2d0;
  float local_2c8;
  pointer local_2c0;
  float local_2b8;
  vector<float,_std::allocator<float>_> zBufferRight;
  vector<float,_std::allocator<float>_> zBufferLeft;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferRightEye;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebufferLeftEye;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> framebuffer;
  Matrix ViewPort;
  string local_218;
  string local_1f8;
  string local_1d8;
  Matrix TotalTransformRight;
  Matrix TotalTransformLeft;
  Matrix ProjectionRight;
  Matrix ProjectionLeft;
  Matrix ModelViewRight;
  Matrix ModelViewLeft;
  Vec3f pointsRight [3];
  Vec3f local_d0;
  Vec3f local_c0;
  Vec3f local_b0;
  Vec3f local_a0;
  Vec3f local_90;
  Vec3f local_80;
  Matrix local_70;
  Matrix local_50;
  
  TGAImage::read_tga_file(&texture,"../res/diablo3_pose_diffuse.tga");
  TGAImage::flip_vertically(&texture);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            (&framebuffer,0x300000,(allocator_type *)pointsLeft);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            (&framebufferLeftEye,0x300000,(allocator_type *)pointsLeft);
  std::vector<Vec3<float>,_std::allocator<Vec3<float>_>_>::vector
            (&framebufferRightEye,0x300000,(allocator_type *)pointsLeft);
  std::vector<float,_std::allocator<float>_>::vector
            (&zBufferLeft,0x300000,(allocator_type *)pointsLeft);
  for (; zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start !=
         zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
      zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + 1) {
    *zBufferLeft.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = -3.4028235e+38;
  }
  std::vector<float,_std::allocator<float>_>::vector
            (&zBufferRight,0x300000,(allocator_type *)pointsLeft);
  for (; zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_start !=
         zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
      zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start = zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
    *zBufferRight.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_start = -3.4028235e+38;
  }
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_90.z = 0.0;
  local_80.x = -0.1;
  local_80.y = 0.0;
  local_80.z = 2.5;
  local_a0.x = 0.0;
  local_a0.y = 1.0;
  local_a0.z = 0.0;
  lookat(&ModelViewLeft,&local_80,&local_90,&local_a0);
  local_b0.x = 0.1;
  local_b0.y = 0.0;
  local_b0.z = 2.5;
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  local_c0.z = 0.0;
  local_d0.x = 0.0;
  local_d0.y = 1.0;
  local_d0.z = 0.0;
  lookat(&ModelViewRight,&local_b0,&local_c0,&local_d0);
  viewport(&ViewPort,0x100,0xc0,0x600,0x480);
  projection(&ProjectionLeft,2.5019991);
  projection(&ProjectionRight,2.5019991);
  Matrix::operator*((Matrix *)pointsLeft,&ViewPort,&ProjectionLeft);
  Matrix::operator*(&TotalTransformLeft,(Matrix *)pointsLeft,&ModelViewLeft);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)pointsLeft);
  Matrix::operator*((Matrix *)pointsLeft,&ViewPort,&ProjectionRight);
  Matrix::operator*(&TotalTransformRight,(Matrix *)pointsLeft,&ModelViewRight);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)pointsLeft);
  pointsLeft[1].y = 0.0;
  pointsLeft[1].z = 0.0;
  pointsLeft[2].x = 0.0;
  pointsLeft[2].y = 0.0;
  pointsLeft[2].z = 0.0;
  pointsLeft[0].x = 0.0;
  pointsLeft[0].y = 0.0;
  pointsLeft[0].z = 0.0;
  pointsLeft[1].x = 0.0;
  pointsRight[1].y = 0.0;
  pointsRight[1].z = 0.0;
  pointsRight[2].x = 0.0;
  pointsRight[2].y = 0.0;
  pointsRight[0].x = 0.0;
  pointsRight[0].y = 0.0;
  pointsRight[0].z = 0.0;
  pointsRight[1].x = 0.0;
  pointsRight[2].z = 0.0;
  for (li = 0; li < (int)(((long)diablo.faces.
                                 super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)diablo.faces.
                                super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x18); li = li + 1) {
    lVar4 = 0;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      iVar1 = Model::vert(&diablo,li,(int)lVar3);
      pVVar2 = Model::point(&diablo,iVar1);
      local_2c0 = *(pointer *)pVVar2;
      local_2b8 = pVVar2->z;
      iVar1 = Model::vert(&diablo,li,(int)lVar3);
      pVVar2 = Model::point(&diablo,iVar1);
      local_2d0 = *(pointer *)pVVar2;
      local_2c8 = pVVar2->z;
      v2m((Matrix *)norms,(Vec3f *)&local_2c0);
      Matrix::operator*(&local_50,&TotalTransformLeft,(Matrix *)norms);
      m2v((Matrix *)text);
      *(Vec2f *)((long)&pointsLeft[0].x + lVar4) = text[0];
      *(float *)((long)&pointsLeft[0].z + lVar4) = text[1].x;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_50.m);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)norms);
      v2m((Matrix *)norms,(Vec3f *)&local_2d0);
      Matrix::operator*(&local_70,&TotalTransformRight,(Matrix *)norms);
      m2v((Matrix *)text);
      *(Vec2f *)((long)&pointsRight[0].x + lVar4) = text[0];
      *(float *)((long)&pointsRight[0].z + lVar4) = text[1].x;
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_70.m);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 *)norms);
      lVar4 = lVar4 + 0xc;
    }
    norms[2].z = 0.0;
    norms[1].y = 0.0;
    norms[1].z = 0.0;
    norms[2].x = 0.0;
    norms[2].y = 0.0;
    text[2].x = 0.0;
    text[2].y = 0.0;
    norms[0].x = 0.0;
    norms[0].y = 0.0;
    norms[0].z = 0.0;
    norms[1].x = 0.0;
    text[0].x = 0.0;
    text[0].y = 0.0;
    text[1].x = 0.0;
    text[1].y = 0.0;
    pfVar5 = &norms[0].z;
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      Model::normal((Model *)local_308,0x10b250,li);
      ((Vec3f *)(pfVar5 + -2))->x = (float)local_308._0_4_;
      ((Vec3f *)(pfVar5 + -2))->y = (float)local_308._4_4_;
      *pfVar5 = (float)local_308._8_4_;
      Model::uv((Model *)local_308,0x10b250,li);
      text[lVar3].x = (float)local_308._0_4_;
      text[lVar3].y = (float)local_308._4_4_;
      pfVar5 = pfVar5 + 3;
    }
    rasterizeTriangle(pointsLeft,norms,text,&framebufferLeftEye,&zBufferLeft);
    rasterizeTriangle(pointsRight,norms,text,&framebufferRightEye,&zBufferRight);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"Left",(allocator<char> *)norms);
  writeInFile(&framebufferLeftEye,0x800,0x600,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"Right",(allocator<char> *)norms);
  writeInFile(&framebufferRightEye,0x800,0x600,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  for (lVar3 = 8; lVar3 != 0x2400008; lVar3 = lVar3 + 0xc) {
    fVar8 = *(float *)((long)&(framebufferLeftEye.
                               super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                               _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    uVar7 = *(undefined8 *)
             ((long)framebufferLeftEye.
                    super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar3 + -8);
    fVar11 = (float)uVar7;
    fVar9 = (float)((ulong)uVar7 >> 0x20);
    fVar10 = fVar8;
    if (fVar8 <= fVar9) {
      fVar10 = fVar9;
    }
    if (fVar10 <= fVar11) {
      fVar10 = fVar11;
    }
    if (1.0 < fVar10) {
      fVar10 = 1.0 / fVar10;
      fVar8 = fVar8 * fVar10;
      uVar7 = CONCAT44(fVar9 * fVar10,fVar11 * fVar10);
      *(undefined8 *)
       ((long)framebufferLeftEye.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar3 + -8) = uVar7;
      *(float *)((long)&(framebufferLeftEye.
                         super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                         super__Vector_impl_data._M_start)->x + lVar3) = fVar8;
    }
    fVar10 = *(float *)((long)framebufferRightEye.
                              super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar3 + -8);
    fVar11 = *(float *)((long)framebufferRightEye.
                              super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl
                              .super__Vector_impl_data._M_start + lVar3 + -4);
    fVar9 = *(float *)((long)&(framebufferRightEye.
                               super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                               _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    fVar6 = fVar9;
    if (fVar9 <= fVar11) {
      fVar6 = fVar11;
    }
    if (fVar6 <= fVar10) {
      fVar6 = fVar10;
    }
    if (1.0 < fVar6) {
      fVar6 = 1.0 / fVar6;
      fVar9 = fVar9 * fVar6;
      fVar11 = fVar11 * fVar6;
      fVar10 = fVar10 * fVar6;
      *(float *)((long)framebufferRightEye.
                       super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3 + -8) = fVar10;
      *(float *)((long)framebufferRightEye.
                       super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar3 + -4) = fVar11;
      *(float *)((long)&(framebufferRightEye.
                         super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                         super__Vector_impl_data._M_start)->x + lVar3) = fVar9;
      uVar7 = *(undefined8 *)
               ((long)framebufferLeftEye.
                      super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar3 + -8);
      fVar8 = *(float *)((long)&(framebufferLeftEye.
                                 super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->x + lVar3);
    }
    *(ulong *)((long)framebuffer.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar3 + -8) =
         CONCAT44(((float)((ulong)uVar7 >> 0x20) + fVar11) * 0.5,((float)uVar7 + fVar8) * 0.5);
    *(float *)((long)&(framebuffer.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->x + lVar3) =
         (fVar9 + fVar10) * 0.5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"17",(allocator<char> *)norms);
  writeInFile(&framebuffer,0x800,0x600,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&TotalTransformRight.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&TotalTransformLeft.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&ProjectionRight.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&ProjectionLeft.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&ViewPort.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&ModelViewRight.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&ModelViewLeft.m);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&zBufferRight.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&zBufferLeft.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>::~_Vector_base
            (&framebufferRightEye.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>);
  std::_Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>::~_Vector_base
            (&framebufferLeftEye.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>);
  std::_Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>::~_Vector_base
            (&framebuffer.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>);
  return;
}

Assistant:

void render(){
    //std::vector<float> zBuffer(width*height);
    //Vec3f camera = Vec3f(0, 0, 2); // camera.z used in the projection matrix, != 0

    texture.read_tga_file("../res/diablo3_pose_diffuse.tga"); // getting texture
    texture.flip_vertically();
    //std::fill(zBuffer.begin(), zBuffer.end(), std::numeric_limits<float>::lowest()); // filling z-buffer

    std::vector<Vec3f> framebuffer(width*height); //used for the fusion
    std::vector<Vec3f> framebufferLeftEye(width*height); //image used for left eye
    std::vector<Vec3f> framebufferRightEye(width*height);//image used for right eye

    //Matrix VP = viewport((float)width/8, (float)height/8, (float)width*3/4, (float)height*3/4); // getting viewport
    //Matrix P  = projection(camera.z);// getting perspective matrix


    std::vector<float> zBufferLeft(width*height);
    std::fill(zBufferLeft.begin(), zBufferLeft.end(), std::numeric_limits<float>::lowest());
    std::vector<float> zBufferRight(width*height);
    std::fill(zBufferRight.begin(), zBufferRight.end(), std::numeric_limits<float>::lowest());

    Vec3f center(0,0,0);

    Vec3f leftEye(-0.1, 0, 2.5);
    Vec3f rightEye(0.1, 0, 2.5);
    Matrix ModelViewLeft = lookat(leftEye, center, Vec3f(0,1,0));
    Matrix ModelViewRight = lookat(rightEye, center, Vec3f(0,1,0));
    Matrix ViewPort = viewport(width/8, height/8, width*3/4, height*3/4);

    Matrix ProjectionLeft = projection((leftEye - center).norm());
    Matrix ProjectionRight = projection((rightEye - center).norm());

    Matrix TotalTransformLeft = ViewPort * ProjectionLeft * ModelViewLeft;
    Matrix TotalTransformRight = ViewPort * ProjectionRight * ModelViewRight;


    // drawing things here
    Vec3f pointsLeft[nbPoints];
    Vec3f pointsRight[nbPoints];
    Vec3f pointLeft;
    Vec3f pointRight;

    #pragma omp parallel for
    for(int i = 0; i < diablo.nfaces(); i++){   // fetching diablo's mesh
        for(int j = 0; j < nbPoints; j++){
            pointLeft = diablo.point(diablo.vert(i, j));
            pointRight = diablo.point(diablo.vert(i, j));

            pointsLeft[j] = m2v(TotalTransformLeft * v2m(pointLeft));
            pointsRight[j] = m2v(TotalTransformRight * v2m(pointRight));
        }

        Vec3f norms[nbPoints];
        Vec2f text[nbPoints];
        // retrieving normal for each vertices, and textures position
        for(int k = 0 ; k < nbPoints; k++){
            norms[k] = diablo.normal(i, k);
            text[k] = diablo.uv(i, k);
        }
        rasterizeTriangle(pointsLeft, norms, text, framebufferLeftEye, zBufferLeft);
        rasterizeTriangle(pointsRight, norms, text, framebufferRightEye, zBufferRight);
    }

    // generating file
    writeInFile(framebufferLeftEye, width, height, "Left");
    writeInFile(framebufferRightEye, width, height, "Right");

    for (size_t i = 0; i < height * width; ++i) {
        Vec3f &c = framebufferLeftEye[i];
        Vec3f &cbis = framebufferRightEye[i];
        Vec3f res;
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max > 1) c = c * (1. / max);
        float maxbis = std::max(cbis[0], std::max(cbis[1], cbis[2]));
        if (maxbis > 1) cbis = cbis * (1. / maxbis);

        res = Vec3f((c.x + c.z) / 2., (c.y + cbis.y)/2., (cbis.x + cbis.z) / 2.);

        framebuffer[i] = res ;

    }


    writeInFile(framebuffer, width, height, "17");



}